

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O1

void jpeg_set_quality(j_compress_ptr cinfo,int quality,boolean force_baseline)

{
  uint uVar1;
  ulong uVar2;
  int scale_factor;
  
  uVar1 = 1;
  if (1 < quality) {
    uVar1 = quality;
  }
  uVar2 = 100;
  if ((int)uVar1 < 100) {
    uVar2 = (ulong)uVar1;
  }
  if (quality < 0x32) {
    scale_factor = (int)(5000 / uVar2);
  }
  else {
    scale_factor = (int)uVar2 * -2 + 200;
  }
  jpeg_add_quant_table(cinfo,0,std_luminance_quant_tbl,scale_factor,force_baseline);
  jpeg_add_quant_table(cinfo,1,std_chrominance_quant_tbl,scale_factor,force_baseline);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_quality (j_compress_ptr cinfo, int quality, boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables.
 * This is the standard quality-adjusting entry point for typical user
 * interfaces; only those who want detailed control over quantization tables
 * would use the preceding three routines directly.
 */
{
  /* Convert user 0-100 rating to percentage scaling */
  quality = jpeg_quality_scaling(quality);

  /* Set up standard quality tables */
  jpeg_set_linear_quality(cinfo, quality, force_baseline);
}